

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O0

bool __thiscall
pktalloc::LightVector<siamese::EncoderSubwindow_*,_25U>::SetSize_Copy
          (LightVector<siamese::EncoderSubwindow_*,_25U> *this,uint elements)

{
  void *__src;
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  void *__dest;
  uint in_ESI;
  void *in_RDI;
  EncoderSubwindow **oldData;
  EncoderSubwindow **newData;
  uint newAllocated;
  
  if (*(uint *)((long)in_RDI + 0xd8) < in_ESI) {
    uVar2 = in_ESI * 3 >> 1;
    auVar1 = ZEXT416(uVar2) * ZEXT816(8);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    __dest = operator_new__(uVar3,(nothrow_t *)&std::nothrow);
    if (__dest == (void *)0x0) {
      return false;
    }
    __src = *(void **)((long)in_RDI + 0xd0);
    *(uint *)((long)in_RDI + 0xd8) = uVar2;
    *(void **)((long)in_RDI + 0xd0) = __dest;
    memcpy(__dest,__src,(ulong)*(uint *)((long)in_RDI + 200) << 3);
    if ((__src != in_RDI) && (__src != (void *)0x0)) {
      operator_delete__(__src);
    }
  }
  *(uint *)((long)in_RDI + 200) = in_ESI;
  return true;
}

Assistant:

bool SetSize_Copy(unsigned elements)
    {
        PKTALLOC_DEBUG_ASSERT(Size <= Allocated);

        // If it is actually expanding, and it needs to grow:
        if (elements > Allocated)
        {
            const unsigned newAllocated = (elements * 3) / 2;
            T* newData = new(std::nothrow) T[newAllocated];
            if (!newData) {
                return false;
            }
            T* oldData = DataPtr;
            Allocated  = newAllocated;
            DataPtr    = newData;

            // Copy data before deletion
            memcpy(newData, oldData, sizeof(T) * Size);

            if (oldData != &PreallocatedData[0]) {
                delete[] oldData;
            }
        }

        Size = elements;
        return true;
    }